

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios.cpp
# Opt level: O3

adios2_io * adios2_declare_io(adios2_adios *adios,char *name)

{
  adios2_io *paVar1;
  allocator aaStack_78 [32];
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"for adios2_adios, in call to adios2_declare_io","");
  adios2::helper::CheckForNullptr<adios2_adios>(adios,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_38,name,aaStack_78);
  paVar1 = (adios2_io *)adios2::core::ADIOS::DeclareIO(adios,local_38,2);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return paVar1;
}

Assistant:

adios2_io *adios2_declare_io(adios2_adios *adios, const char *name)
{
    adios2_io *io = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(adios, "for adios2_adios, in call to adios2_declare_io");
        io = reinterpret_cast<adios2_io *>(
            &reinterpret_cast<adios2::core::ADIOS *>(adios)->DeclareIO(name));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_declare_io");
    }
    return io;
}